

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O1

int32_t stringIteratorGetIndex(UCharIterator *iter,UCharIteratorOrigin origin)

{
  switch(origin) {
  case UITER_START:
    return iter->start;
  case UITER_CURRENT:
    return iter->index;
  case UITER_LIMIT:
    return iter->limit;
  case UITER_ZERO:
    return 0;
  case UITER_LENGTH:
    return iter->length;
  default:
    return -1;
  }
}

Assistant:

static int32_t U_CALLCONV
stringIteratorGetIndex(UCharIterator *iter, UCharIteratorOrigin origin) {
    switch(origin) {
    case UITER_ZERO:
        return 0;
    case UITER_START:
        return iter->start;
    case UITER_CURRENT:
        return iter->index;
    case UITER_LIMIT:
        return iter->limit;
    case UITER_LENGTH:
        return iter->length;
    default:
        /* not a valid origin */
        /* Should never get here! */
        return -1;
    }
}